

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diplodocus.cpp
# Opt level: O3

void getStats(void)

{
  int iVar1;
  size_type *psVar2;
  undefined8 uVar3;
  ostream *poVar4;
  long *plVar5;
  long *plVar6;
  size_type *local_650;
  ofstream contextTriplesstats;
  ios_base aiStack_558 [264];
  size_type *local_450;
  ofstream ProvIdxstats;
  undefined8 local_440 [29];
  ios_base aiStack_358 [264];
  size_type *local_250;
  ofstream Moleculesstats;
  size_type local_240;
  __node_base local_238;
  size_type local_230;
  long local_228;
  size_t sStack_220;
  __node_base_ptr local_218;
  ios_base aiStack_158 [264];
  _AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,_false>_>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing stats",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  local_450 = local_440;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_450,diplo::statsDir_abi_cxx11_,
             DAT_00142bc8 + diplo::statsDir_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_450);
  std::ofstream::ofstream(&local_650,(string *)&local_450,_S_out);
  if (local_450 != local_440) {
    operator_delete(local_450);
  }
  plVar6 = (long *)(diplo::contextTriples + 0x10);
  while (plVar6 = (long *)*plVar6, plVar6 != (long *)0x0) {
    iVar1 = *(int *)(plVar6 + 2);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&local_650);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
    plVar5 = (long *)std::ostream::operator<<(poVar4,iVar1);
    std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
    std::ostream::put((char)plVar5);
    std::ostream::flush();
  }
  local_250 = &local_240;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_250,diplo::statsDir_abi_cxx11_,
             DAT_00142bc8 + diplo::statsDir_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_250);
  std::ofstream::ofstream(&local_450,(string *)&local_250,_S_out);
  if (local_250 != &local_240) {
    operator_delete(local_250);
  }
  if (diplo::ProvIdx._16_8_ != 0) {
    plVar6 = (long *)diplo::ProvIdx._16_8_;
    do {
      local_250 = (size_type *)plVar6[1];
      _Moleculesstats = (__buckets_ptr)0x0;
      local_240 = plVar6[3];
      local_238._M_nxt = (_Hash_node_base *)0x0;
      local_230 = plVar6[5];
      local_228 = plVar6[6];
      sStack_220 = plVar6[7];
      local_218 = (__node_base_ptr)0x0;
      local_50._M_h = (__hashtable_alloc *)&Moleculesstats;
      std::
      _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_assign<std::_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&Moleculesstats,
                 (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)(plVar6 + 2),&local_50);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&local_450);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)&Moleculesstats);
      plVar6 = (long *)*plVar6;
    } while (plVar6 != (long *)0x0);
  }
  local_50._M_h = (__hashtable_alloc *)&__str_2._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,diplo::statsDir_abi_cxx11_,
             DAT_00142bc8 + diplo::statsDir_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_50);
  std::ofstream::ofstream(&local_250,(string *)&local_50,_S_out);
  if (local_50._M_h != (__hashtable_alloc *)&__str_2._M_string_length) {
    operator_delete(local_50._M_h);
  }
  if (diplo::M._64_8_ != 0) {
    plVar6 = (long *)diplo::M._64_8_;
    do {
      local_50._M_h = (__hashtable_alloc *)plVar6[1];
      std::
      vector<std::pair<unsigned_long,_std::vector<std::pair<unsigned_long,_Entity>,_std::allocator<std::pair<unsigned_long,_Entity>_>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<std::pair<unsigned_long,_Entity>,_std::allocator<std::pair<unsigned_long,_Entity>_>_>_>_>_>
      ::vector((vector<std::pair<unsigned_long,_std::vector<std::pair<unsigned_long,_Entity>,_std::allocator<std::pair<unsigned_long,_Entity>_>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<std::pair<unsigned_long,_Entity>,_std::allocator<std::pair<unsigned_long,_Entity>_>_>_>_>_>
                *)&__str_2,
               (vector<std::pair<unsigned_long,_std::vector<std::pair<unsigned_long,_Entity>,_std::allocator<std::pair<unsigned_long,_Entity>_>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<std::pair<unsigned_long,_Entity>,_std::allocator<std::pair<unsigned_long,_Entity>_>_>_>_>_>
                *)(plVar6 + 2));
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&local_250);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      Molecule::~Molecule((Molecule *)&__str_2);
      plVar6 = (long *)*plVar6;
    } while (plVar6 != (long *)0x0);
  }
  uVar3 = _memcpy;
  psVar2 = _VTT;
  local_250 = _VTT;
  *(undefined8 *)((long)&local_250 + _VTT[-3]) = _memcpy;
  std::filebuf::~filebuf((filebuf *)&Moleculesstats);
  std::ios_base::~ios_base(aiStack_158);
  local_450 = psVar2;
  *(undefined8 *)((long)&local_450 + psVar2[-3]) = uVar3;
  std::filebuf::~filebuf((filebuf *)&ProvIdxstats);
  std::ios_base::~ios_base(aiStack_358);
  local_650 = psVar2;
  *(undefined8 *)((long)&local_650 + psVar2[-3]) = uVar3;
  std::filebuf::~filebuf((filebuf *)&contextTriplesstats);
  std::ios_base::~ios_base(aiStack_558);
  return;
}

Assistant:

void getStats() {
    cout << "writing stats" << endl;
    ofstream contextTriplesstats(statsDir+"contextTriples.stats");
    for (auto i : contextTriples) {
        contextTriplesstats << i.first << "\t" << i.second << endl;
    }

    ofstream ProvIdxstats(statsDir+"ProvIdx.stats");
    for (auto i : ProvIdx) {
        ProvIdxstats << i.first << "\t" << i.second.size() << endl;
    }

    ofstream Moleculesstats(statsDir+"Molecules.stats");
    for (auto i : M.molecules) {
        Moleculesstats << i.first << "\t" << i.second.next.size() << endl;
    }
}